

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_debug_getmetatable(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  GCobj *o;
  TRef TVar2;
  TRef TVar3;
  TRef TVar4;
  ulong uVar5;
  long lVar6;
  IRRef1 IVar7;
  uint uVar8;
  bool bVar9;
  
  uVar1 = *J->base;
  uVar8 = uVar1 & 0x1f000000;
  if (uVar8 == 0xb000000) {
    IVar7 = 5;
  }
  else {
    if (uVar8 != 0xc000000) {
      uVar5 = rd->argv->it64 >> 0x2f;
      lVar6 = 0x23;
      if (0xfffffffffffffff2 < uVar5) {
        lVar6 = 0x15 - uVar5;
      }
      o = *(GCobj **)((long)J + lVar6 * 8 + -0x130);
      if (o == (GCobj *)0x0) {
        TVar4 = 0x7fff;
      }
      else {
        TVar4 = lj_ir_kgc(J,o,IRT_TAB);
      }
      goto LAB_00158a9a;
    }
    IVar7 = 0xb;
  }
  lVar6 = *(long *)((rd->argv->u64 & 0x7fffffffffff) + 0x20);
  (J->fold).ins.field_0.ot = 0x450b;
  (J->fold).ins.field_0.op1 = (IRRef1)uVar1;
  (J->fold).ins.field_0.op2 = IVar7;
  TVar2 = lj_opt_fold(J);
  bVar9 = lVar6 != 0;
  TVar4 = 0x7fff;
  if (bVar9) {
    TVar4 = TVar2;
  }
  TVar3 = lj_ir_knull(J,IRT_TAB);
  (J->fold).ins.field_0.ot = (ushort)bVar9 << 8 | 0x88b;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
  lj_opt_fold(J);
LAB_00158a9a:
  *J->base = TVar4;
  return;
}

Assistant:

static void LJ_FASTCALL recff_debug_getmetatable(jit_State *J, RecordFFData *rd)
{
  GCtab *mt;
  TRef mtref;
  TRef tr = J->base[0];
  if (tref_istab(tr)) {
    mt = tabref(tabV(&rd->argv[0])->metatable);
    mtref = emitir(IRT(IR_FLOAD, IRT_TAB), tr, IRFL_TAB_META);
  } else if (tref_isudata(tr)) {
    mt = tabref(udataV(&rd->argv[0])->metatable);
    mtref = emitir(IRT(IR_FLOAD, IRT_TAB), tr, IRFL_UDATA_META);
  } else {
    mt = tabref(basemt_obj(J2G(J), &rd->argv[0]));
    J->base[0] = mt ? lj_ir_ktab(J, mt) : TREF_NIL;
    return;
  }
  emitir(IRTG(mt ? IR_NE : IR_EQ, IRT_TAB), mtref, lj_ir_knull(J, IRT_TAB));
  J->base[0] = mt ? mtref : TREF_NIL;
}